

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O1

size_t __thiscall camp::ArrayProperty::size(ArrayProperty *this,UserObject *object)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ForbiddenRead *__return_storage_ptr__;
  string *propertyName;
  string local_b0;
  string local_90;
  ForbiddenRead local_70;
  
  bVar1 = Property::readable(&this->super_Property,object);
  if (bVar1) {
    iVar2 = (*(this->super_Property).super_TagHolder._vptr_TagHolder[7])(this,object);
    return CONCAT44(extraout_var,iVar2);
  }
  __return_storage_ptr__ = (ForbiddenRead *)__cxa_allocate_exception(0x48);
  propertyName = Property::name_abi_cxx11_(&this->super_Property);
  ForbiddenRead::ForbiddenRead(&local_70,propertyName);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"std::size_t camp::ArrayProperty::size(const UserObject &) const",
             "");
  Error::prepare<camp::ForbiddenRead>(__return_storage_ptr__,&local_70,&local_90,0x44,&local_b0);
  __cxa_throw(__return_storage_ptr__,&ForbiddenRead::typeinfo,Error::~Error);
}

Assistant:

std::size_t ArrayProperty::size(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getSize(object);
}